

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O3

void __thiscall
mp::SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
          (SOLHandler_Easy *this,VecReader<double> *rd)

{
  NLSolution *pNVar1;
  pointer pdVar2;
  long lVar3;
  double dVar4;
  
  pNVar1 = this->sol_;
  pdVar2 = (pNVar1->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pNVar1->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (pNVar1->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = pdVar2;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&pNVar1->x_,(long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars);
  if (rd->n_ != 0) {
    lVar3 = 0;
    do {
      dVar4 = VecReader<double>::ReadNext(rd);
      (this->sol_->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start
      [*(int *)((long)(this->pd_->vperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar3)] = dVar4;
      lVar3 = lVar3 + 4;
    } while (rd->n_ != 0);
  }
  return;
}

Assistant:

void OnPrimalSolution(VecReader& rd) {
    sol_.x_.clear();
    sol_.x_.resize(header_.num_vars);
    for (int i=0; rd.Size(); ++i)    // Permute
      sol_.x_[pd_.vperm_inv_[i]] = rd.ReadNext();
  }